

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_helper_in_func(TCGContext *tcg_ctx,MemOp ot,TCGv_i64 v,TCGv_i32 n)

{
  code *func;
  TCGTemp *local_18;
  TCGv_i32 local_10;
  
  local_18 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_10 = n + (long)tcg_ctx;
  if (ot == MO_32) {
    func = helper_inl_x86_64;
  }
  else if (ot == MO_16) {
    func = helper_inw_x86_64;
  }
  else {
    func = helper_inb_x86_64;
  }
  tcg_gen_callN_x86_64(tcg_ctx,func,(TCGTemp *)(v + (long)tcg_ctx),2,&local_18);
  return;
}

Assistant:

static void gen_helper_in_func(TCGContext *tcg_ctx, MemOp ot, TCGv v, TCGv_i32 n)
{
    switch (ot) {
    case MO_8:
        gen_helper_inb(tcg_ctx, v, tcg_ctx->cpu_env, n);
        break;
    case MO_16:
        gen_helper_inw(tcg_ctx, v, tcg_ctx->cpu_env, n);
        break;
    case MO_32:
        gen_helper_inl(tcg_ctx, v, tcg_ctx->cpu_env, n);
        break;
    default:
        tcg_abort();
    }
}